

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeGraph.cpp
# Opt level: O1

void __thiscall
Assimp::OptimizeGraphProcess::SetupProperties(OptimizeGraphProcess *this,Importer *pImp)

{
  string tmp;
  string local_58;
  string local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  Importer::GetPropertyString(&local_38,pImp,"PP_OG_EXCLUDE_LIST",&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  ConvertListToStrings(&local_38,&this->locked_nodes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void OptimizeGraphProcess::SetupProperties(const Importer* pImp) {
    // Get value of AI_CONFIG_PP_OG_EXCLUDE_LIST
    std::string tmp = pImp->GetPropertyString(AI_CONFIG_PP_OG_EXCLUDE_LIST,"");
    AddLockedNodeList(tmp);
}